

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  __off_t _Var8;
  CManager p_Var9;
  undefined8 uVar10;
  FILE *pFVar11;
  ostream *poVar12;
  long lVar13;
  long *plVar14;
  undefined8 extraout_RAX;
  int fd;
  ulong uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  int Port;
  char final_filename [256];
  char buffer [256];
  Remote_evpath_state ev_state;
  ofstream fileOut;
  int local_4a4;
  int local_4a0;
  long *local_498;
  long local_490;
  long local_488 [30];
  long local_398 [32];
  Remote_evpath_state local_298;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  bVar18 = true;
  if (argc < 2) goto LAB_00112a2e;
  iVar16 = 1;
  iVar3 = 0;
  iVar17 = 0;
  local_4a0 = 0;
  local_4a4 = 0;
  do {
    __s1 = argv[iVar16];
    iVar1 = strcmp(__s1,"-background");
    if (iVar1 == 0) {
      iVar3 = iVar3 + 1;
    }
    else {
      iVar1 = strcmp(__s1,"-kill_server");
      if (iVar1 == 0) {
        iVar17 = iVar17 + 1;
      }
      else {
        iVar1 = strcmp(__s1,"-report_port_selection");
        if (iVar1 == 0) {
          report_port_selection = report_port_selection + 1;
        }
        else {
          iVar1 = strcmp(__s1,"-status");
          if (iVar1 == 0) {
            local_4a4 = local_4a4 + 1;
          }
          else {
            iVar1 = strcmp(__s1,"-no_timeout");
            if (iVar1 == 0) {
              local_4a0 = local_4a0 + 1;
            }
            else {
              if (*__s1 != '-') {
LAB_00112d88:
                main_cold_1();
LAB_00112d90:
                main_cold_2();
                goto LAB_00112d95;
              }
              if ((__s1[1] == 'v') && (__s1[2] == '\0')) {
                verbose = verbose + 1;
              }
              else if ((__s1[1] == 'q') && (__s1[2] == '\0')) {
                verbose = verbose + -1;
              }
              else if ((__s1[1] == 'l') && (__s1[2] == '\0')) {
                iVar16 = iVar16 + 1;
                if (argc <= iVar16) {
                  main_cold_3();
                  std::ofstream::~ofstream(&local_230);
                  _Unwind_Resume(extraout_RAX);
                }
                std::ofstream::open((char *)&local_230,(_Ios_Openmode)argv[iVar16]);
                std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              }
              else {
                if ((__s1[1] != 't') || (__s1[2] != '\0')) goto LAB_00112d88;
                iVar16 = iVar16 + 1;
                if (argc <= iVar16) goto LAB_00112d90;
                maxThreads = strtol(argv[iVar16],(char **)0x0,10);
              }
            }
          }
        }
      }
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 < argc);
  bVar18 = local_4a0 == 0;
  if (iVar17 == 0) {
    if (local_4a4 == 0) {
      if (iVar3 != 0) {
        if ((verbose != 0) && (report_port_selection == 0)) {
          puts("Forking server to background");
        }
        parent_pid = getpid();
        _Var2 = fork();
        if (_Var2 != 0) {
          if (report_port_selection != 0) {
            snprintf((char *)&local_498,0x100,"/tmp/port_file_%x",(ulong)(uint)parent_pid);
            pFVar11 = fopen((char *)&local_498,"r");
            if (pFVar11 == (FILE *)0x0) {
              do {
                sleep(1);
                pFVar11 = fopen((char *)&local_498,"r");
              } while (pFVar11 == (FILE *)0x0);
            }
            fread(local_398,1,0x100,pFVar11);
            fputs((char *)local_398,_stdout);
            fflush(_stdout);
          }
          close(0);
          close(1);
          close(2);
          goto LAB_00112dab;
        }
        iVar16 = 0;
        do {
          iVar3 = fcntl(iVar16,1);
          if (iVar3 == -1) {
            piVar7 = __errno_location();
            if (*piVar7 != 9) goto LAB_00112a02;
          }
          else {
LAB_00112a02:
            _Var8 = lseek(iVar16,0,1);
            if (_Var8 == -1) {
              piVar7 = __errno_location();
              if (*piVar7 == 0x1d) {
                close(iVar16);
              }
            }
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != 0x11);
      }
LAB_00112a2e:
      p_Var9 = (CManager)CManager_create();
      if (bVar18) {
        local_398[0] = 0;
        local_498 = (long *)operator_new(0x18);
        *local_498 = (long)&PTR___State_00141ae0;
        local_498[1] = (long)p_Var9;
        *(undefined4 *)(local_498 + 2) = 60000;
        std::thread::_M_start_thread(local_398,&local_498,0);
        if (local_498 != (long *)0x0) {
          (**(code **)(*local_498 + 8))();
        }
        std::thread::detach();
        if (local_398[0] != 0) {
          std::terminate();
        }
      }
      uVar4 = attr_atom_from_string("IP_PORT");
      uVar10 = create_attr_list();
      if (report_port_selection == 0) {
        add_attr(uVar10,uVar4,1,0x6658);
        CMlisten_specific(p_Var9,uVar10);
      }
      else {
        CMlisten(p_Var9);
        uVar10 = CMget_contact_list(p_Var9);
        get_int_attr(uVar10,uVar4);
        uVar5 = getpid();
        uVar15 = 0;
        snprintf((char *)&local_498,0x100,"/tmp/port_file_%x",(ulong)uVar5);
        snprintf((char *)local_398,0x100,"/tmp/port_file_%x",(ulong)(uint)parent_pid);
        pFVar11 = fopen((char *)&local_498,"w");
        uVar5 = 0xffffffe1;
        do {
          uVar6 = rand();
          uVar15 = (ulong)uVar6 ^ uVar15 << 0x1f;
          uVar5 = uVar5 + 0x1f;
        } while (uVar5 < 0x21);
        random_cookie = uVar15;
        fprintf(pFVar11,"port:%d;msg:%s;cookie:%#018lx\n",0xffffffff,"no_error",uVar15);
        fclose(pFVar11);
        rename((char *)&local_498,(char *)local_398);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hostname = ",0xb);
      adios2::helper::GetFQDN_abi_cxx11_();
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_498,local_490);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if (local_498 != local_488) {
        operator_delete(local_498);
      }
      lVar13 = CMget_contact_list(p_Var9);
      if (lVar13 != 0) {
        local_498 = (long *)CONCAT44(local_498._4_4_,0xffffffff);
        get_int_attr(uVar10,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Listening on Port ",0x12);
        plVar14 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_498);
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
      }
      local_298.cm = p_Var9;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Max threads = ",0xe)
      ;
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      adios2::EVPathRemoteCommon::RegisterFormats(&local_298);
      ServerRegisterHandlers(&local_298);
      CMrun_network(p_Var9);
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___cxa_allocate_exception;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      return 0;
    }
    connect_and_get_status(0x6658);
  }
  else {
LAB_00112d95:
    connect_and_kill(0x6658);
  }
LAB_00112dab:
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
    CManager cm;
    struct Remote_evpath_state ev_state;
    int background = 0;
    int kill_server = 0;
    int status_server = 0;
    int no_timeout = 0; // default to timeout
    std::ofstream fileOut;

    for (int i = 1; i < argc; i++)
    {
        if (strcmp(argv[i], "-background") == 0)
        {
            background++;
        }
        else if (strcmp(argv[i], "-kill_server") == 0)
        {
            kill_server++;
        }
        else if (strcmp(argv[i], "-report_port_selection") == 0)
        {
            report_port_selection++;
        }
        else if (strcmp(argv[i], "-status") == 0)
        {
            status_server++;
        }
        else if (strcmp(argv[i], "-no_timeout") == 0)
        {
            no_timeout++;
        }
        else if (strcmp(argv[i], "-v") == 0)
        {
            verbose++;
        }
        else if (strcmp(argv[i], "-q") == 0)
        {
            verbose--;
        }
        else if (strcmp(argv[i], "-l") == 0)
        {
            i++;
            if (argc <= i)
            {
                fprintf(stderr, "Flag -l requires an argument\n");
                fprintf(stderr, usage);
                exit(1);
            }
            char *filename = argv[i];
            // Opening the output file stream and associate it with
            // logfile
            fileOut.open(filename);

            // Redirecting cout to write to logfile
            std::cout.rdbuf(fileOut.rdbuf());
        }
        else if (strcmp(argv[i], "-t") == 0)
        {
            i++;
            if (argc <= i)
            {
                fprintf(stderr, "Flag -t requires an argument\n");
                fprintf(stderr, usage);
                exit(1);
            }
            maxThreads = strtol(argv[i], nullptr, 10);
        }
        else
        {
            fprintf(stderr, "Unknown argument \"%s\"\n", argv[i]);
            fprintf(stderr, usage);
            exit(1);
        }
    }

    if (kill_server)
    {
        connect_and_kill(ServerPort);
        exit(0);
    }
    if (status_server)
    {
        connect_and_get_status(ServerPort);
        exit(0);
    }
    if (background)
    {
        if (verbose && !report_port_selection)
        {
            printf("Forking server to background\n");
        }
#ifdef _MSC_VER
        STARTUPINFO si;
        PROCESS_INFORMATION pi;
        char comm_line[8191];

        ZeroMemory(&si, sizeof(si));
        si.cb = sizeof(si);
        ZeroMemory(&pi, sizeof(pi));
        char module[MAX_PATH];
        GetModuleFileName(NULL, &module[0], MAX_PATH);
        int i = 1;
        strcpy(comm_line, module);
        strcat(comm_line, " ");
        if (!CreateProcess(module, comm_line,
                           NULL,  // Process handle not inheritable
                           NULL,  // Thread handle not inheritable
                           FALSE, // Set handle inheritance to FALSE
                           0,     // No creation flags
                           NULL,  // Use parent's environment block
                           NULL,  // Use parent's starting directory
                           &si,   // Pointer to STARTUPINFO structure
                           &pi))
        {
            printf("CreateProcess failed (%d).\n", GetLastError());
            //	    printf("Args were argv[0] = %s\n", args[0]);
            //	    printf("Args were argv[1] = %s, argv[2] = %s\n", args[1], args[2]);
            exit(1);
        }
        exit(0);
#else
        parent_pid = getpid();
        if (fork() != 0)
        {
            /* I'm the parent, wait a sec to let the child start, then exit */
            //            sleep(1);
            if (report_port_selection)
            {
                char final_filename[256];
                snprintf(final_filename, sizeof(final_filename), "/tmp/port_file_%x", parent_pid);
                FILE *f = NULL;
                f = fopen(final_filename, "r");
                while (f == NULL)
                {
                    sleep(1); // wait until available
                    f = fopen(final_filename, "r");
                }
                char buffer[256];
                fread(buffer, 1, 256, f);
                // Note: printf("%s", buffer); does not seem to flush properly
                fprintf(stdout, "%s", buffer);
                fflush(stdout);
            }
            close(0);
            close(1);
            close(2);
            exit(0);
        }

        //  Why close a bunch of FDs here?  Well, if we've linked with XRootD, stderr might have
        //  been dup()'d in library initialization.  We don't need those FDs and we have to
        //  close them to make sure we disassociate from the CTest parent (or else fixture
        //  startup hangs). It doesn't seem to work to close them before the fork, so we close
        //  them afterwards.
        for (int fd = 0; fd <= 16; fd++)
        {
            if (fd_is_valid(fd))
            {
                // OK, fd is valid, should we close it?
                if ((lseek(fd, 0, SEEK_CUR) == -1) && (errno == ESPIPE))
                {
                    // In the circumstances we care about (running under CTest), we want to
                    // close FDs that are pipes.  The condition above tests for that and we
                    // should get here only if it's a pipe.
                    close(fd);
                }
            }
        }
#endif
    }

    cm = CManager_create();
    if (!no_timeout)
        timer_start((void *)cm, 60 * 1000); // check timeout on 1 minute boundaries
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    attr_list listen_list = NULL;

    if (listen_list == NULL)
        listen_list = create_attr_list();
    if (!report_port_selection)
    {
        // listen on well-known port
        add_attr(listen_list, CM_IP_PORT, Attr_Int4, (attr_value)ServerPort);
        CMlisten_specific(cm, listen_list);
    }
    else
    {
        // randomize port
        CMlisten(cm);
        listen_list = CMget_contact_list(cm);
        int Port = -1;
        get_int_attr(listen_list, CM_IP_PORT, &Port);
        char filename[256];
        char final_filename[256];
        snprintf(filename, sizeof(filename), "/tmp/port_file_%x", getpid());
        snprintf(final_filename, sizeof(final_filename), "/tmp/port_file_%x", parent_pid);
        FILE *f = fopen(filename, "w");
        random_cookie = rand64();
        fprintf(f, "port:%d;msg:%s;cookie:%#018" PRIx64 "\n", Port, "no_error", random_cookie);
        fclose(f);
        rename(filename, final_filename);
    }

    std::cout << "Hostname = " << helper::GetFQDN() << std::endl;
    attr_list contact_list = CMget_contact_list(cm);
    if (contact_list)
    {
        int Port = -1;
        get_int_attr(listen_list, CM_IP_PORT, &Port);
        std::cout << "Listening on Port " << Port << std::endl;
    }
    ev_state.cm = cm;
    std::cout << "Max threads = " << maxThreads << std::endl;

    RegisterFormats(ev_state);

    ServerRegisterHandlers(ev_state);

    CMrun_network(cm);
    return 0;
}